

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

uint32_t units::getCommodity(string *comm)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  pointer ppVar4;
  pointer pvVar5;
  char *pcVar6;
  ulong uVar7;
  size_type sVar8;
  reference pcVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  uint32_t hcode;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  uint shift;
  uint32_t hkey;
  const_iterator fnd;
  iterator fnd2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  _Alloc_hider in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t uVar10;
  undefined4 in_stack_ffffffffffffff74;
  char cVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [2];
  int local_6c;
  uint32_t local_68;
  char *local_60;
  char *local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  uint32_t local_4;
  
  removeEscapeSequences((string *)in_stack_ffffffffffffff40._M_current);
  local_18 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                               (in_stack_ffffffffffffff28);
  local_20 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                               (in_RDI._M_current);
  local_28 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                               (in_stack_ffffffffffffff28);
  local_30 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                               (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_RDI,
                                (_func_int_int *)in_stack_ffffffffffffff30);
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_RDI._M_current,
                     (memory_order)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)0x757a1e), !bVar1)) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)in_stack_ffffffffffffff28,(key_type *)0x757a33);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)in_stack_ffffffffffffff28);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                             *)0x757a79);
      return ppVar4->second;
    }
  }
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)in_stack_ffffffffffffff28,(key_type *)0x757a9d);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator==(&local_48,&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                    (size_type)in_stack_ffffffffffffff50._M_p,in_stack_ffffffffffffff48._M_current);
    if (iVar2 == 0) {
      pcVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x757b1b
                      );
      uVar7 = strtoul(pcVar6 + 7,(char **)0x0,0);
      local_4 = (uint32_t)uVar7;
    }
    else {
      sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_RDI._M_current);
      if (sVar8 < 6) {
        local_58 = (char *)CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                     (in_stack_ffffffffffffff28);
        local_60 = (char *)CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                     (in_RDI._M_current);
        bVar1 = std::
                all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,units::getCommodity(std::__cxx11::string)::__0>
                          (local_58,local_60);
        if (bVar1) {
          local_68 = 0x40000000;
          local_6c = 0;
          local_80[0]._M_current =
               (char *)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                 (in_stack_ffffffffffffff28);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_RDI._M_current);
          while (bVar1 = __gnu_cxx::
                         operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   (in_stack_ffffffffffffff30,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_ffffffffffffff28), ((bVar1 ^ 0xffU) & 1) != 0) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(local_80);
            cVar11 = *pcVar9;
            if (cVar11 == ' ') {
              cVar11 = '_';
            }
            local_68 = ((int)(char)(cVar11 + -0x5f) << ((byte)local_6c & 0x1f)) + local_68;
            local_6c = local_6c + 5;
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(local_80);
          }
          return local_68;
        }
      }
      uVar3 = stringHash((string *)in_stack_ffffffffffffff50._M_p);
      uVar10 = uVar3 & 0x1fffffff | 0x60000000;
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff50;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT44(in_stack_ffffffffffffff74,uVar3) & 0xffffffff1fffffff | 0x60000000),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      addCustomCommodity((string *)CONCAT44(in_stack_ffffffffffffff74,uVar10),
                         in_stack_ffffffffffffff6c);
      std::__cxx11::string::~string(this);
      local_4 = uVar10;
    }
  }
  else {
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                           *)0x757ae3);
    local_4 = pvVar5->second;
  }
  return local_4;
}

Assistant:

uint32_t getCommodity(std::string comm)
{
    removeEscapeSequences(comm);
    std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityCodes.empty()) {
            auto fnd2 = customCommodityCodes.find(comm);
            if (fnd2 != customCommodityCodes.end()) {
                return fnd2->second;
            }
        }
    }

    auto fnd = commodities::commodity_codes.find(comm);
    if (fnd != commodities::commodity_codes.end()) {
        return fnd->second;
    }

    if (comm.compare(0, 7, "cxcomm[") == 0) {
        return strtoul(comm.c_str() + 7, nullptr, 0);
    }
    if ((comm.size() < 6) && std::all_of(comm.begin(), comm.end(), [](char x) {
            return (x == ' ' || (x >= '_' && x <= '}'));
        })) {
        std::uint32_t hkey{0x40000000};
        unsigned int shift{0};
        for (auto c : comm) {
            if (c == ' ') {
                c = '_';
            }
            c -= '_';
            hkey += static_cast<std::uint32_t>(c) << shift;
            shift += 5;
        }
        return hkey;
    }
    // generate a hash code for a custom string
    auto hcode = stringHash(comm);
    hcode &= 0x1FFFFFFFU;
    hcode |= 0x60000000U;
    addCustomCommodity(comm, hcode);

    return hcode;
}